

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int select_cipher(ptls_cipher_suite_t **selected,ptls_cipher_suite_t **candidates,uint8_t *src,
                 uint8_t *end)

{
  int iVar1;
  long *local_40;
  ptls_cipher_suite_t **c;
  uint16_t id;
  uint8_t *puStack_30;
  int ret;
  uint8_t *end_local;
  uint8_t *src_local;
  ptls_cipher_suite_t **candidates_local;
  ptls_cipher_suite_t **selected_local;
  
  puStack_30 = end;
  end_local = src;
  src_local = (uint8_t *)candidates;
  candidates_local = selected;
  while( true ) {
    if (end_local == puStack_30) {
      return 0x28;
    }
    iVar1 = ptls_decode16((uint16_t *)((long)&c + 2),&end_local,puStack_30);
    if (iVar1 != 0) break;
    for (local_40 = (long *)src_local; *local_40 != 0; local_40 = local_40 + 1) {
      if (*(short *)*local_40 == c._2_2_) {
        *candidates_local = (ptls_cipher_suite_t *)*local_40;
        return 0;
      }
    }
    c._4_4_ = 0;
  }
  return iVar1;
}

Assistant:

static int select_cipher(ptls_cipher_suite_t **selected, ptls_cipher_suite_t **candidates, const uint8_t *src,
                         const uint8_t *const end)
{
    int ret;

    while (src != end) {
        uint16_t id;
        if ((ret = ptls_decode16(&id, &src, end)) != 0)
            goto Exit;
        ptls_cipher_suite_t **c = candidates;
        for (; *c != NULL; ++c) {
            if ((*c)->id == id) {
                *selected = *c;
                return 0;
            }
        }
    }

    ret = PTLS_ALERT_HANDSHAKE_FAILURE;

Exit:
    return ret;
}